

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBlobReadOnly(SyBlob *pBlob,void *pData,sxu32 nByte)

{
  sxu32 nByte_local;
  void *pData_local;
  SyBlob *pBlob_local;
  
  pBlob->pBlob = pData;
  pBlob->nByte = nByte;
  pBlob->mByte = 0;
  pBlob->nFlags = pBlob->nFlags | 4;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobReadOnly(SyBlob *pBlob, const void *pData, sxu32 nByte)
{
#if defined(UNTRUST)
	if( pBlob == 0  ){
		return SXERR_EMPTY;
	}
#endif
	pBlob->pBlob = (void *)pData;
	pBlob->nByte = nByte;
	pBlob->mByte = 0;
	pBlob->nFlags |= SXBLOB_RDONLY;
	return SXRET_OK;
}